

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

int __thiscall DeviceTy::disassociatePtr(DeviceTy *this,void *HstPtrBegin)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->DataMapMtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar2 = -1;
  p_Var3 = (_List_node_base *)&this->HostDataToTargetMap;
  do {
    p_Var3 = (((_List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
              &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->HostDataToTargetMap) goto LAB_00102f23;
  } while (p_Var3[1]._M_prev != (_List_node_base *)HstPtrBegin);
  if (0x1fffffffffffffff < (long)p_Var3[3]._M_next) {
    psVar1 = &(this->HostDataToTargetMap).
              super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3);
    iVar2 = 0;
  }
LAB_00102f23:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return iVar2;
}

Assistant:

int DeviceTy::disassociatePtr(void *HstPtrBegin) {
  DataMapMtx.lock();

  // Check if entry exists
  for (HostDataToTargetListTy::iterator ii = HostDataToTargetMap.begin();
      ii != HostDataToTargetMap.end(); ++ii) {
    if ((uintptr_t)HstPtrBegin == ii->HstPtrBegin) {
      // Mapping exists
      if (CONSIDERED_INF(ii->RefCount)) {
        DP("Association found, removing it\n");
        HostDataToTargetMap.erase(ii);
        DataMapMtx.unlock();
        return OFFLOAD_SUCCESS;
      } else {
        DP("Trying to disassociate a pointer which was not mapped via "
            "omp_target_associate_ptr\n");
        break;
      }
    }
  }

  // Mapping not found
  DataMapMtx.unlock();
  DP("Association not found\n");
  return OFFLOAD_FAIL;
}